

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O0

iterator __thiscall
Type1ToType2Converter::CollectHintIndexesFromHere
          (Type1ToType2Converter *this,iterator inFirstStemHint)

{
  bool bVar1;
  pointer pCVar2;
  reference plVar3;
  mapped_type *pmVar4;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar5;
  Stem local_198;
  _Base_ptr local_188;
  undefined1 local_180;
  Stem local_178;
  _Base_ptr local_168;
  undefined1 local_160;
  Stem local_158;
  long local_148;
  long origin_3;
  long extent_3;
  reverse_iterator<std::_List_const_iterator<long>_> local_130;
  const_reverse_iterator itOperands_3;
  Stem local_118;
  _Base_ptr local_108;
  undefined1 local_100;
  Stem local_f8;
  _Base_ptr local_e8;
  undefined1 local_e0;
  Stem local_d8;
  long local_c8;
  long origin_2;
  long extent_2;
  reverse_iterator<std::_List_const_iterator<long>_> local_b0;
  const_reverse_iterator itOperands_2;
  Stem local_98;
  long local_88;
  long origin_1;
  long extent_1;
  reverse_iterator<std::_List_const_iterator<long>_> local_70;
  const_reverse_iterator itOperands_1;
  Stem local_58;
  long local_48;
  long origin;
  long extent;
  reverse_iterator<std::_List_const_iterator<long>_> local_30;
  const_reverse_iterator itOperands;
  Type1ToType2Converter *this_local;
  iterator inFirstStemHint_local;
  iterator it;
  
  inFirstStemHint_local._M_node = inFirstStemHint._M_node;
  do {
    itOperands.current._M_node =
         (_List_const_iterator<long>)
         std::__cxx11::list<ConversionNode,_std::allocator<ConversionNode>_>::end
                   (&this->mConversionProgram);
    bVar1 = std::operator!=(&inFirstStemHint_local,(_Self *)&itOperands);
    if (!bVar1) {
      return (iterator)inFirstStemHint_local._M_node;
    }
    pCVar2 = std::_List_iterator<ConversionNode>::operator->(&inFirstStemHint_local);
    if (pCVar2->mMarkerType == 1) {
      std::_List_iterator<ConversionNode>::operator->(&inFirstStemHint_local);
      std::__cxx11::list<long,_std::allocator<long>_>::rbegin
                ((list<long,_std::allocator<long>_> *)&extent);
      std::reverse_iterator<std::_List_const_iterator<long>>::
      reverse_iterator<std::_List_iterator<long>>
                ((reverse_iterator<std::_List_const_iterator<long>> *)&local_30,
                 (reverse_iterator<std::_List_iterator<long>_> *)&extent);
      plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_30);
      origin = *plVar3;
      std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_30);
      plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_30);
      local_48 = *plVar3;
      Stem::Stem(&local_58,local_48,origin);
      pmVar4 = std::
               map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
               ::operator[](&this->mHStems,&local_58);
      pVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              insert(&this->mCurrentHints,pmVar4);
      itOperands_1.current._M_node = (_List_const_iterator<long>)pVar5.first._M_node;
    }
    else {
      pCVar2 = std::_List_iterator<ConversionNode>::operator->(&inFirstStemHint_local);
      if (pCVar2->mMarkerType == 3) {
        std::_List_iterator<ConversionNode>::operator->(&inFirstStemHint_local);
        std::__cxx11::list<long,_std::allocator<long>_>::rbegin
                  ((list<long,_std::allocator<long>_> *)&extent_1);
        std::reverse_iterator<std::_List_const_iterator<long>>::
        reverse_iterator<std::_List_iterator<long>>
                  ((reverse_iterator<std::_List_const_iterator<long>> *)&local_70,
                   (reverse_iterator<std::_List_iterator<long>_> *)&extent_1);
        plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_70);
        origin_1 = *plVar3;
        std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_70);
        plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_70);
        local_88 = *plVar3;
        Stem::Stem(&local_98,local_88,origin_1);
        pmVar4 = std::
                 map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
                 ::operator[](&this->mVStems,&local_98);
        pVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                insert(&this->mCurrentHints,pmVar4);
        itOperands_2.current._M_node = (_List_const_iterator<long>)pVar5.first._M_node;
      }
      else {
        pCVar2 = std::_List_iterator<ConversionNode>::operator->(&inFirstStemHint_local);
        if (pCVar2->mMarkerType == 0xc01) {
          std::_List_iterator<ConversionNode>::operator->(&inFirstStemHint_local);
          std::__cxx11::list<long,_std::allocator<long>_>::rbegin
                    ((list<long,_std::allocator<long>_> *)&extent_2);
          std::reverse_iterator<std::_List_const_iterator<long>>::
          reverse_iterator<std::_List_iterator<long>>
                    ((reverse_iterator<std::_List_const_iterator<long>> *)&local_b0,
                     (reverse_iterator<std::_List_iterator<long>_> *)&extent_2);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_b0);
          origin_2 = *plVar3;
          std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_b0);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_b0);
          local_c8 = *plVar3;
          Stem::Stem(&local_d8,local_c8,origin_2);
          pmVar4 = std::
                   map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
                   ::operator[](&this->mVStems,&local_d8);
          pVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::insert(&this->mCurrentHints,pmVar4);
          local_e8 = (_Base_ptr)pVar5.first._M_node;
          local_e0 = pVar5.second;
          std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_b0);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_b0);
          origin_2 = *plVar3;
          std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_b0);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_b0);
          local_c8 = *plVar3;
          Stem::Stem(&local_f8,local_c8,origin_2);
          pmVar4 = std::
                   map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
                   ::operator[](&this->mVStems,&local_f8);
          pVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::insert(&this->mCurrentHints,pmVar4);
          local_108 = (_Base_ptr)pVar5.first._M_node;
          local_100 = pVar5.second;
          std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_b0);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_b0);
          origin_2 = *plVar3;
          std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_b0);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_b0);
          local_c8 = *plVar3;
          Stem::Stem(&local_118,local_c8,origin_2);
          pmVar4 = std::
                   map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
                   ::operator[](&this->mVStems,&local_118);
          pVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::insert(&this->mCurrentHints,pmVar4);
          itOperands_3.current._M_node = (_List_const_iterator<long>)pVar5.first._M_node;
        }
        else {
          pCVar2 = std::_List_iterator<ConversionNode>::operator->(&inFirstStemHint_local);
          if (pCVar2->mMarkerType != 0xc02) {
            return (iterator)inFirstStemHint_local._M_node;
          }
          std::_List_iterator<ConversionNode>::operator->(&inFirstStemHint_local);
          std::__cxx11::list<long,_std::allocator<long>_>::rbegin
                    ((list<long,_std::allocator<long>_> *)&extent_3);
          std::reverse_iterator<std::_List_const_iterator<long>>::
          reverse_iterator<std::_List_iterator<long>>
                    ((reverse_iterator<std::_List_const_iterator<long>> *)&local_130,
                     (reverse_iterator<std::_List_iterator<long>_> *)&extent_3);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_130);
          origin_3 = *plVar3;
          std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_130);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_130);
          local_148 = *plVar3;
          Stem::Stem(&local_158,local_148,origin_3);
          pmVar4 = std::
                   map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
                   ::operator[](&this->mHStems,&local_158);
          pVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::insert(&this->mCurrentHints,pmVar4);
          local_168 = (_Base_ptr)pVar5.first._M_node;
          local_160 = pVar5.second;
          std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_130);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_130);
          origin_3 = *plVar3;
          std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_130);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_130);
          local_148 = *plVar3;
          Stem::Stem(&local_178,local_148,origin_3);
          pmVar4 = std::
                   map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
                   ::operator[](&this->mHStems,&local_178);
          pVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::insert(&this->mCurrentHints,pmVar4);
          local_188 = (_Base_ptr)pVar5.first._M_node;
          local_180 = pVar5.second;
          std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_130);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_130);
          origin_3 = *plVar3;
          std::reverse_iterator<std::_List_const_iterator<long>_>::operator++(&local_130);
          plVar3 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*(&local_130);
          local_148 = *plVar3;
          Stem::Stem(&local_198,local_148,origin_3);
          pmVar4 = std::
                   map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
                   ::operator[](&this->mHStems,&local_198);
          std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                    (&this->mCurrentHints,pmVar4);
        }
      }
    }
    std::_List_iterator<ConversionNode>::operator++(&inFirstStemHint_local);
  } while( true );
}

Assistant:

ConversionNodeList::iterator Type1ToType2Converter::CollectHintIndexesFromHere(ConversionNodeList::iterator inFirstStemHint)
{
	ConversionNodeList::iterator it = inFirstStemHint;
	for(; it != mConversionProgram.end();++it)
	{
		// hstem
		if(1 == it->mMarkerType)
		{
			LongList::const_reverse_iterator itOperands = it->mOperands.rbegin();

			long extent = *itOperands;
			++itOperands;
			long origin = *itOperands;
			mCurrentHints.insert(mHStems[Stem(origin,extent)]);
			
		} // vstem
		else if(3 == it->mMarkerType)
		{
			LongList::const_reverse_iterator itOperands = it->mOperands.rbegin();

			long extent = *itOperands;
			++itOperands;
			long origin = *itOperands;
			mCurrentHints.insert(mVStems[Stem(origin,extent)]);
		}// vstem3
		else if(0x0c01 == it->mMarkerType)
		{
			LongList::const_reverse_iterator itOperands = it->mOperands.rbegin();

			long extent = *itOperands;
			++itOperands;
			long origin = *itOperands;
			mCurrentHints.insert(mVStems[Stem(origin,extent)]);
			++itOperands;
			extent = *itOperands;
			++itOperands;
			origin = *itOperands;
			mCurrentHints.insert(mVStems[Stem(origin,extent)]);
			++itOperands;
			extent = *itOperands;
			++itOperands;
			origin = *itOperands;
			mCurrentHints.insert(mVStems[Stem(origin,extent)]);
		}// hstem3
		else if(0x0c02 == it->mMarkerType)
		{
			LongList::const_reverse_iterator itOperands = it->mOperands.rbegin();

			long extent = *itOperands;
			++itOperands;
			long origin = *itOperands;
			mCurrentHints.insert(mHStems[Stem(origin,extent)]);
			++itOperands;
			extent = *itOperands;
			++itOperands;
			origin = *itOperands;
			mCurrentHints.insert(mHStems[Stem(origin,extent)]);
			++itOperands;
			extent = *itOperands;
			++itOperands;
			origin = *itOperands;
			mCurrentHints.insert(mHStems[Stem(origin,extent)]);
		}
		else // stop stem set
		{
			break;
		}
	}
	return it; // return first instruction out of this set
}